

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void __thiscall image_pixel_setf(void *this,uint rMax,uint gMax,uint bMax,uint aMax)

{
  uint aMax_local;
  uint bMax_local;
  uint gMax_local;
  uint rMax_local;
  image_pixel *this_local;
  
  *(double *)((long)this + 0x18) = (double)*this / (double)rMax;
  *(double *)((long)this + 0x20) = (double)*(uint *)((long)this + 4) / (double)gMax;
  *(double *)((long)this + 0x28) = (double)*(uint *)((long)this + 8) / (double)bMax;
  *(double *)((long)this + 0x30) = (double)*(uint *)((long)this + 0xc) / (double)aMax;
  if (*this < rMax) {
    *(double *)((long)this + 0x38) = *(double *)((long)this + 0x18) * 2.220446049250313e-16;
  }
  else {
    *(undefined8 *)((long)this + 0x38) = 0;
  }
  if (*(uint *)((long)this + 4) < gMax) {
    *(double *)((long)this + 0x40) = *(double *)((long)this + 0x20) * 2.220446049250313e-16;
  }
  else {
    *(undefined8 *)((long)this + 0x40) = 0;
  }
  if (*(uint *)((long)this + 8) < bMax) {
    *(double *)((long)this + 0x48) = *(double *)((long)this + 0x28) * 2.220446049250313e-16;
  }
  else {
    *(undefined8 *)((long)this + 0x48) = 0;
  }
  if (*(uint *)((long)this + 0xc) < aMax) {
    *(double *)((long)this + 0x50) = *(double *)((long)this + 0x30) * 2.220446049250313e-16;
  }
  else {
    *(undefined8 *)((long)this + 0x50) = 0;
  }
  return;
}

Assistant:

static void
image_pixel_setf(image_pixel *this, unsigned int rMax, unsigned int gMax,
        unsigned int bMax, unsigned int aMax)
{
   this->redf = this->red / (double)rMax;
   this->greenf = this->green / (double)gMax;
   this->bluef = this->blue / (double)bMax;
   this->alphaf = this->alpha / (double)aMax;

   if (this->red < rMax)
      this->rede = this->redf * DBL_EPSILON;
   else
      this->rede = 0;
   if (this->green < gMax)
      this->greene = this->greenf * DBL_EPSILON;
   else
      this->greene = 0;
   if (this->blue < bMax)
      this->bluee = this->bluef * DBL_EPSILON;
   else
      this->bluee = 0;
   if (this->alpha < aMax)
      this->alphae = this->alphaf * DBL_EPSILON;
   else
      this->alphae = 0;
}